

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

wchar_t player_get_next_place(wchar_t place,char *direction,wchar_t multiple)

{
  level_map_conflict *map;
  bool bVar1;
  int iVar2;
  level_conflict *plVar3;
  level_conflict *plVar4;
  long lVar5;
  char *name;
  level_conflict *current;
  level_conflict *plVar6;
  
  map = world;
  if (world->levels == (level_conflict *)0x0) {
    __assert_fail("start",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                  ,0x67,"int player_get_next_place(int, const char *, int)");
  }
  plVar6 = world->levels + place;
  iVar2 = strcmp(direction,"north");
  if (iVar2 == 0) {
    name = plVar6->north;
LAB_001c0504:
    if (name == (char *)0x0) {
      return L'\xffffffff';
    }
  }
  else {
    iVar2 = strcmp(direction,"east");
    if (iVar2 == 0) {
      name = plVar6->east;
      goto LAB_001c0504;
    }
    iVar2 = strcmp(direction,"south");
    if (iVar2 == 0) {
      name = plVar6->south;
      goto LAB_001c0504;
    }
    iVar2 = strcmp(direction,"west");
    if (iVar2 == 0) {
      name = plVar6->west;
      goto LAB_001c0504;
    }
    if (((*direction != 'u') || (direction[1] != 'p')) || (direction[2] != '\0')) {
      iVar2 = strcmp(direction,"down");
      if (iVar2 != 0) {
        return place;
      }
      if (plVar6->down == (char *)0x0) {
        name = "Underworld Town";
        if ((TOP_MOUNTAINTOP < plVar6->topography) ||
           ((0x381U >> (plVar6->topography & 0x1f) & 1) == 0)) goto LAB_001c0509;
      }
      if (multiple == L'\0') {
        return place;
      }
      bVar1 = quest_forbid_downstairs(plVar6->index);
      plVar4 = plVar6;
      while( true ) {
        if (bVar1) {
          return place;
        }
        if (plVar4->down == (char *)0x0) break;
        plVar3 = level_by_name(world,plVar4->down);
        place = plVar3->index;
        lVar5 = (long)place;
        if (lVar5 < 0) break;
        multiple = multiple + L'\xffffffff';
        if (multiple == L'\0') {
          return place;
        }
        plVar4 = world->levels + lVar5;
        bVar1 = quest_forbid_downstairs(world->levels[lVar5].index);
      }
      if (plVar4 == plVar6) {
        return L'\xffffffff';
      }
      goto LAB_001c0514;
    }
    name = plVar6->up;
    if (name == (char *)0x0) {
      name = "Mountain Top Town";
      if ((plVar6->topography < (TOP_VALLEY|TOP_FOREST)) &&
         ((0x391U >> (plVar6->topography & 0x1f) & 1) != 0)) {
        return L'\xffffffff';
      }
    }
  }
LAB_001c0509:
  plVar4 = level_by_name(map,name);
LAB_001c0514:
  return plVar4->index;
}

Assistant:

int player_get_next_place(int place, const char *direction, int multiple)
{
	int next_place = place;
	struct level *start = &world->levels[place];
	assert(start);

	/* Follow the given direction (possibly multiple times for down) */
	if (streq(direction, "north")) {
		next_place = start->north ?
			level_by_name(world, start->north)->index : -1;
	} else if (streq(direction, "east")) {
		next_place = start->east ?
			level_by_name(world, start->east)->index : -1;
	} else if (streq(direction, "south")) {
		next_place = start->south ?
			level_by_name(world, start->south)->index : -1;
	} else if (streq(direction, "west")) {
		next_place = start->west ?
			level_by_name(world, start->west)->index : -1;
	} else if (streq(direction, "up")) {
		if (mountain_top_possible(place)) {
			/* Find stupidly named level */
			struct level *next = level_by_name(world, "Mountain Top Town");
			next_place = next->index;
		} else {
			next_place = start->up ?
				level_by_name(world, start->up)->index : -1;
		}
	} else if (streq(direction, "down")) {
		if (underworld_possible(place)) {
			/* Find stupidly named level */
			struct level *next = level_by_name(world, "Underworld Town");
			next_place = next->index;
		} else {
			struct level *lev = start;
			while (multiple) {
				/* Stop at unfinished quest levels */
				if (quest_forbid_downstairs(lev->index)) break;

				/* Go down */
				next_place = lev->down ?
					level_by_name(world, lev->down)->index : -1;

				/* Check failures */
				if (next_place < 0) {
					/* If we've taken some steps use the last valid one */
					if (lev != start) {
						return lev->index;
					} else {
						return -1;
					}
				}
				lev = &world->levels[next_place];
				multiple--;
			}
		}
	}

	return next_place;
}